

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.c
# Opt level: O3

void DrawRectangleLines(int posX,int posY,int width,int height,Color color)

{
  float fVar1;
  Rectangle rec;
  Rectangle rec_00;
  Rectangle rec_01;
  Rectangle rec_02;
  
  fVar1 = (float)posX;
  rec.y = (float)posY;
  rec.x = fVar1;
  rec.height = 1.0;
  rec.width = (float)width;
  DrawRectanglePro(rec,(Vector2)0x0,0.0,color);
  rec_00.x = (float)(width + posX + -1);
  rec_02.height = (float)(height + -2);
  rec_02.width = 1.0;
  rec_00.y = (float)(posY + 1);
  rec_00.height = (float)(height + -2);
  rec_00.width = 1.0;
  DrawRectanglePro(rec_00,(Vector2)0x0,0.0,color);
  rec_01.height = 1.0;
  rec_01.width = (float)width;
  rec_01.y = (float)(posY + height + -1);
  rec_01.x = fVar1;
  DrawRectanglePro(rec_01,(Vector2)0x0,0.0,color);
  rec_02.y = (float)(posY + 1);
  rec_02.x = fVar1;
  DrawRectanglePro(rec_02,(Vector2)0x0,0.0,color);
  return;
}

Assistant:

void DrawRectangleLines(int posX, int posY, int width, int height, Color color)
{
#if defined(SUPPORT_QUADS_DRAW_MODE)
    DrawRectangle(posX, posY, width, 1, color);
    DrawRectangle(posX + width - 1, posY + 1, 1, height - 2, color);
    DrawRectangle(posX, posY + height - 1, width, 1, color);
    DrawRectangle(posX, posY + 1, 1, height - 2, color);
#else
    rlBegin(RL_LINES);
        rlColor4ub(color.r, color.g, color.b, color.a);
        rlVertex2i(posX + 1, posY + 1);
        rlVertex2i(posX + width, posY + 1);

        rlVertex2i(posX + width, posY + 1);
        rlVertex2i(posX + width, posY + height);

        rlVertex2i(posX + width, posY + height);
        rlVertex2i(posX + 1, posY + height);

        rlVertex2i(posX + 1, posY + height);
        rlVertex2i(posX + 1, posY + 1);
    rlEnd();
#endif
}